

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 207_courseSchedule.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  vector<int,_std::allocator<int>_> *local_c0;
  allocator<std::vector<int,_std::allocator<int>_>_> local_a1;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  undefined1 local_80 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vv;
  allocator<int> local_41;
  int local_40 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 0;
  local_40[0] = 1;
  local_40[1] = 0;
  local_38 = local_40;
  local_30 = 2;
  std::allocator<int>::allocator(&local_41);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_41);
  std::allocator<int>::~allocator(&local_41);
  local_a0 = &local_98;
  std::vector<int,_std::allocator<int>_>::vector
            (local_a0,(vector<int,_std::allocator<int>_> *)local_28);
  local_80._0_8_ = &local_98;
  local_80._8_8_ = (pointer)0x1;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_a1);
  __l._M_len = local_80._8_8_;
  __l._M_array = (iterator)local_80._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_80 + 0x10),__l,&local_a1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_a1);
  local_c0 = (vector<int,_std::allocator<int>_> *)local_80;
  do {
    local_c0 = local_c0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_c0);
  } while (local_c0 != &local_98);
  bVar1 = canFinish(2,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)(local_80 + 0x10));
  std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_80 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	vector<int> v = {1,0};
	vector<vector<int>> vv{v};
	cout<<canFinish(2,vv);
}